

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib557.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  size_t sVar40;
  long lVar41;
  char *pcVar42;
  char *pcVar43;
  ulong uVar44;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  char local_238 [520];
  
  setlocale(1,"C");
  iVar1 = curl_msnprintf(local_238,0x100,
                         "%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d"
                         ,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,
                         7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5);
  if (iVar1 != 0x80) {
    curl_mprintf("curl_mprintf() returned %d and not 128!\n",iVar1);
  }
  iVar2 = _string_check(0x5dc,local_238,
                        "01234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567"
                       );
  iVar2 = iVar2 + (uint)(iVar1 != 0x80);
  local_238[0] = '\0';
  iVar1 = curl_msnprintf(local_238,0x100,
                         "%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d%d"
                         ,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,
                         7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5,6,7,8,9,0,1,2,3,4,5);
  if (iVar1 != -1) {
    curl_mprintf("curl_mprintf() returned %d and not -1!\n",iVar1);
    iVar2 = iVar2 + 1;
  }
  iVar1 = _string_check(0x602,local_238,"");
  if (iVar1 + iVar2 != 0) {
    curl_mprintf("Some curl_mprintf() weird arguments tests failed!\n");
  }
  us_test[1].num = 0xffff;
  us_test[1].expected = "65535";
  us_test[2].num = 0xff00;
  us_test[2].expected = "65280";
  us_test[3].num = 0xff;
  us_test[3].expected = "255";
  us_test[4].num = 0xf000;
  us_test[4].expected = "61440";
  us_test[5].num = 0xf00;
  us_test[5].expected = "3840";
  us_test[6].num = 0xf0;
  us_test[6].expected = "240";
  us_test[7].num = 0xf;
  us_test[7].expected = "15";
  us_test[8].num = 0xc000;
  us_test[8].expected = "49152";
  us_test[9].num = 0xc00;
  us_test[9].expected = "3072";
  us_test[10].num = 0xc0;
  us_test[10].expected = "192";
  us_test[0xb].num = 0xc;
  us_test[0xb].expected = "12";
  us_test[0xc].num = 1;
  us_test[0xc].expected = "1";
  us_test[0xd].num = 0;
  us_test[0xd].expected = "0";
  lVar41 = 0x1081b0;
  local_274 = 0;
  for (uVar44 = 1; uVar44 != 0xe; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = us_test[uVar44].result;
    us_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%hu",us_test[uVar44].num);
    pcVar42 = us_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("unsigned short test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_274 = local_274 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() unsigned short tests Failed!\n";
  if (local_274 == 0) {
    pcVar42 = "All curl_mprintf() unsigned short tests OK!\n";
  }
  curl_mprintf(pcVar42);
  ss_test[1].num = 0x7fff;
  ss_test[1].expected = "32767";
  ss_test[2].num = 0x7ffe;
  ss_test[2].expected = "32766";
  ss_test[3].num = 0x7ffd;
  ss_test[3].expected = "32765";
  ss_test[4].num = 0x7f00;
  ss_test[4].expected = "32512";
  ss_test[5].num = 0x7f0;
  ss_test[5].expected = "2032";
  ss_test[6].num = 0x7f;
  ss_test[6].expected = "127";
  ss_test[7].num = 0x7000;
  ss_test[7].expected = "28672";
  ss_test[8].num = 0x700;
  ss_test[8].expected = "1792";
  ss_test[9].num = 0x70;
  ss_test[9].expected = "112";
  ss_test[10].num = 7;
  ss_test[10].expected = "7";
  ss_test[0xb].num = 0x5000;
  ss_test[0xb].expected = "20480";
  ss_test[0xc].num = 0x500;
  ss_test[0xc].expected = "1280";
  ss_test[0xd].num = 0x50;
  ss_test[0xd].expected = "80";
  ss_test[0xe].num = 5;
  ss_test[0xe].expected = "5";
  ss_test[0xf].num = 1;
  ss_test[0xf].expected = "1";
  ss_test[0x10].num = 0;
  ss_test[0x10].expected = "0";
  ss_test[0x11].num = -0x8000;
  ss_test[0x11].expected = "-32768";
  ss_test[0x12].num = -0x7fff;
  ss_test[0x12].expected = "-32767";
  ss_test[0x13].num = -0x7ffe;
  ss_test[0x13].expected = "-32766";
  ss_test[0x14].num = -0x7f01;
  ss_test[0x14].expected = "-32513";
  ss_test[0x15].num = -0x7f1;
  ss_test[0x15].expected = "-2033";
  ss_test[0x16].num = -0x80;
  ss_test[0x16].expected = "-128";
  ss_test[0x17].num = -0x7001;
  ss_test[0x17].expected = "-28673";
  ss_test[0x18].num = -0x701;
  ss_test[0x18].expected = "-1793";
  ss_test[0x19].num = -0x71;
  ss_test[0x19].expected = "-113";
  ss_test[0x1a].num = -8;
  ss_test[0x1a].expected = "-8";
  ss_test[0x1b].num = -0x5001;
  ss_test[0x1b].expected = "-20481";
  ss_test[0x1c].num = -0x501;
  ss_test[0x1c].expected = "-1281";
  ss_test[0x1d].num = -0x51;
  ss_test[0x1d].expected = "-81";
  ss_test[0x1e].num = -6;
  ss_test[0x1e].expected = "-6";
  ss_test[0x1f].num = -1;
  ss_test[0x1f].expected = "-1";
  lVar41 = 0x10ed00;
  local_260 = 0;
  for (uVar44 = 1; uVar44 != 0x20; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = ss_test[uVar44].result;
    ss_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%hd",(int)ss_test[uVar44].num);
    pcVar42 = ss_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("signed short test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_260 = local_260 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() signed short tests Failed!\n";
  if (local_260 == 0) {
    pcVar42 = "All curl_mprintf() signed short tests OK!\n";
  }
  curl_mprintf(pcVar42);
  ui_test[1].num = 0xffffffff;
  ui_test[1].expected = "4294967295";
  ui_test[2].num = 0xffff0000;
  ui_test[2].expected = "4294901760";
  ui_test[3].num = 0xffff;
  ui_test[3].expected = "65535";
  ui_test[4].num = 0xff000000;
  ui_test[4].expected = "4278190080";
  ui_test[5].num = 0xff0000;
  ui_test[5].expected = "16711680";
  ui_test[6].num = 0xff00;
  ui_test[6].expected = "65280";
  ui_test[7].num = 0xff;
  ui_test[7].expected = "255";
  ui_test[8].num = 0xf0000000;
  ui_test[8].expected = "4026531840";
  ui_test[9].num = 0xf000000;
  ui_test[9].expected = "251658240";
  ui_test[10].num = 0xf00000;
  ui_test[10].expected = "15728640";
  ui_test[0xb].num = 0xf0000;
  ui_test[0xb].expected = "983040";
  ui_test[0xc].num = 0xf000;
  ui_test[0xc].expected = "61440";
  ui_test[0xd].num = 0xf00;
  ui_test[0xd].expected = "3840";
  ui_test[0xe].num = 0xf0;
  ui_test[0xe].expected = "240";
  ui_test[0xf].num = 0xf;
  ui_test[0xf].expected = "15";
  ui_test[0x10].num = 0xc0000000;
  ui_test[0x10].expected = "3221225472";
  ui_test[0x11].num = 0xc000000;
  ui_test[0x11].expected = "201326592";
  ui_test[0x12].num = 0xc00000;
  ui_test[0x12].expected = "12582912";
  ui_test[0x13].num = 0xc0000;
  ui_test[0x13].expected = "786432";
  ui_test[0x14].num = 0xc000;
  ui_test[0x14].expected = "49152";
  ui_test[0x15].num = 0xc00;
  ui_test[0x15].expected = "3072";
  ui_test[0x16].num = 0xc0;
  ui_test[0x16].expected = "192";
  ui_test[0x17].num = 0xc;
  ui_test[0x17].expected = "12";
  ui_test[0x18].num = 1;
  ui_test[0x18].expected = "1";
  ui_test[0x19].num = 0;
  ui_test[0x19].expected = "0";
  lVar41 = 0x115850;
  local_264 = 0;
  for (uVar44 = 1; uVar44 != 0x1a; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = ui_test[uVar44].result;
    ui_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%u",ui_test[uVar44].num);
    pcVar42 = ui_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("unsigned int test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_264 = local_264 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() unsigned int tests Failed!\n";
  if (local_264 == 0) {
    pcVar42 = "All curl_mprintf() unsigned int tests OK!\n";
  }
  curl_mprintf(pcVar42);
  si_test[1].num = 0x7fffffff;
  si_test[1].expected = "2147483647";
  si_test[2].num = 0x7ffffffe;
  si_test[2].expected = "2147483646";
  si_test[3].num = 0x7ffffffd;
  si_test[3].expected = "2147483645";
  si_test[4].num = 0x7fff0000;
  si_test[4].expected = "2147418112";
  si_test[5].num = 0x7fff;
  si_test[5].expected = "32767";
  si_test[6].num = 0x7f000000;
  si_test[6].expected = "2130706432";
  si_test[7].num = 0x7f0000;
  si_test[7].expected = "8323072";
  si_test[8].num = 0x7f00;
  si_test[8].expected = "32512";
  si_test[9].num = 0x7f;
  si_test[9].expected = "127";
  si_test[10].num = 0x70000000;
  si_test[10].expected = "1879048192";
  si_test[0xb].num = 0x7000000;
  si_test[0xb].expected = "117440512";
  si_test[0xc].num = 0x700000;
  si_test[0xc].expected = "7340032";
  si_test[0xd].num = 0x70000;
  si_test[0xd].expected = "458752";
  si_test[0xe].num = 0x7000;
  si_test[0xe].expected = "28672";
  si_test[0xf].num = 0x700;
  si_test[0xf].expected = "1792";
  si_test[0x10].num = 0x70;
  si_test[0x10].expected = "112";
  si_test[0x11].num = 7;
  si_test[0x11].expected = "7";
  si_test[0x12].num = 0x50000000;
  si_test[0x12].expected = "1342177280";
  si_test[0x13].num = 0x5000000;
  si_test[0x13].expected = "83886080";
  si_test[0x14].num = 0x500000;
  si_test[0x14].expected = "5242880";
  si_test[0x15].num = 0x50000;
  si_test[0x15].expected = "327680";
  si_test[0x16].num = 0x5000;
  si_test[0x16].expected = "20480";
  si_test[0x17].num = 0x500;
  si_test[0x17].expected = "1280";
  si_test[0x18].num = 0x50;
  si_test[0x18].expected = "80";
  si_test[0x19].num = 5;
  si_test[0x19].expected = "5";
  si_test[0x1a].num = 1;
  si_test[0x1a].expected = "1";
  si_test[0x1b].num = 0;
  si_test[0x1b].expected = "0";
  si_test[0x1c].num = -0x80000000;
  si_test[0x1c].expected = "-2147483648";
  si_test[0x1d].num = -0x7fffffff;
  si_test[0x1d].expected = "-2147483647";
  si_test[0x1e].num = -0x7ffffffe;
  si_test[0x1e].expected = "-2147483646";
  si_test[0x1f].num = -0x7fff0001;
  si_test[0x1f].expected = "-2147418113";
  si_test[0x20].num = -0x8000;
  si_test[0x20].expected = "-32768";
  si_test[0x21].num = -0x7f000001;
  si_test[0x21].expected = "-2130706433";
  si_test[0x22].num = -0x7f0001;
  si_test[0x22].expected = "-8323073";
  si_test[0x23].num = -0x7f01;
  si_test[0x23].expected = "-32513";
  si_test[0x24].num = -0x80;
  si_test[0x24].expected = "-128";
  si_test[0x25].num = -0x70000001;
  si_test[0x25].expected = "-1879048193";
  si_test[0x26].num = -0x7000001;
  si_test[0x26].expected = "-117440513";
  si_test[0x27].num = -0x700001;
  si_test[0x27].expected = "-7340033";
  si_test[0x28].num = -0x70001;
  si_test[0x28].expected = "-458753";
  si_test[0x29].num = -0x7001;
  si_test[0x29].expected = "-28673";
  si_test[0x2a].num = -0x701;
  si_test[0x2a].expected = "-1793";
  si_test[0x2b].num = -0x71;
  si_test[0x2b].expected = "-113";
  si_test[0x2c].num = -8;
  si_test[0x2c].expected = "-8";
  si_test[0x2d].num = -0x50000001;
  si_test[0x2d].expected = "-1342177281";
  si_test[0x2e].num = -0x5000001;
  si_test[0x2e].expected = "-83886081";
  si_test[0x2f].num = -0x500001;
  si_test[0x2f].expected = "-5242881";
  si_test[0x30].num = -0x50001;
  si_test[0x30].expected = "-327681";
  si_test[0x31].num = -0x5001;
  si_test[0x31].expected = "-20481";
  si_test[0x32].num = -0x501;
  si_test[0x32].expected = "-1281";
  si_test[0x33].num = -0x51;
  si_test[0x33].expected = "-81";
  si_test[0x34].num = -6;
  si_test[0x34].expected = "-6";
  si_test[0x35].num = -1;
  si_test[0x35].expected = "-1";
  lVar41 = 0x11c3a0;
  local_268 = 0;
  for (uVar44 = 1; uVar44 != 0x36; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = si_test[uVar44].result;
    si_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%d",si_test[uVar44].num);
    pcVar42 = si_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("signed int test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_268 = local_268 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() signed int tests Failed!\n";
  if (local_268 == 0) {
    pcVar42 = "All curl_mprintf() signed int tests OK!\n";
  }
  curl_mprintf(pcVar42);
  ul_test[1].num = 0xffffffffffffffff;
  ul_test[1].expected = "18446744073709551615";
  ul_test[2].num = 0xffffffff00000000;
  ul_test[2].expected = "18446744069414584320";
  ul_test[3].num = 0xffffffff;
  ul_test[3].expected = "4294967295";
  ul_test[4].num = 0xffff000000000000;
  ul_test[4].expected = "18446462598732840960";
  ul_test[5].num = 0xffff00000000;
  ul_test[5].expected = "281470681743360";
  ul_test[6].num = 0xffff0000;
  ul_test[6].expected = "4294901760";
  ul_test[7].num = 0xffff;
  ul_test[7].expected = "65535";
  ul_test[8].num = 0xff00000000000000;
  ul_test[8].expected = "18374686479671623680";
  ul_test[9].num = 0xff000000000000;
  ul_test[9].expected = "71776119061217280";
  ul_test[10].num = 0xff0000000000;
  ul_test[10].expected = "280375465082880";
  ul_test[0xb].num = 0xff00000000;
  ul_test[0xb].expected = "1095216660480";
  ul_test[0xc].num = 0xff000000;
  ul_test[0xc].expected = "4278190080";
  ul_test[0xd].num = 0xff0000;
  ul_test[0xd].expected = "16711680";
  ul_test[0xe].num = 0xff00;
  ul_test[0xe].expected = "65280";
  ul_test[0xf].num = 0xff;
  ul_test[0xf].expected = "255";
  ul_test[0x10].num = 0xf000000000000000;
  ul_test[0x10].expected = "17293822569102704640";
  ul_test[0x11].num = 0xf00000000000000;
  ul_test[0x11].expected = "1080863910568919040";
  ul_test[0x12].num = 0xf0000000000000;
  ul_test[0x12].expected = "67553994410557440";
  ul_test[0x13].num = 0xf000000000000;
  ul_test[0x13].expected = "4222124650659840";
  ul_test[0x14].num = 0xf00000000000;
  ul_test[0x14].expected = "263882790666240";
  ul_test[0x15].num = 0xf0000000000;
  ul_test[0x15].expected = "16492674416640";
  ul_test[0x16].num = 0xf000000000;
  ul_test[0x16].expected = "1030792151040";
  ul_test[0x17].num = 0xf00000000;
  ul_test[0x17].expected = "64424509440";
  ul_test[0x18].num = 0xf0000000;
  ul_test[0x18].expected = "4026531840";
  ul_test[0x19].num = 0xf000000;
  ul_test[0x19].expected = "251658240";
  ul_test[0x1a].num = 0xf00000;
  ul_test[0x1a].expected = "15728640";
  ul_test[0x1b].num = 0xf0000;
  ul_test[0x1b].expected = "983040";
  ul_test[0x1c].num = 0xf000;
  ul_test[0x1c].expected = "61440";
  ul_test[0x1d].num = 0xf00;
  ul_test[0x1d].expected = "3840";
  ul_test[0x1e].num = 0xf0;
  ul_test[0x1e].expected = "240";
  ul_test[0x1f].num = 0xf;
  ul_test[0x1f].expected = "15";
  ul_test[0x20].num = 0xc000000000000000;
  ul_test[0x20].expected = "13835058055282163712";
  ul_test[0x21].num = 0xc00000000000000;
  ul_test[0x21].expected = "864691128455135232";
  ul_test[0x22].num = 0xc0000000000000;
  ul_test[0x22].expected = "54043195528445952";
  ul_test[0x23].num = 0xc000000000000;
  ul_test[0x23].expected = "3377699720527872";
  ul_test[0x24].num = 0xc00000000000;
  ul_test[0x24].expected = "211106232532992";
  ul_test[0x25].num = 0xc0000000000;
  ul_test[0x25].expected = "13194139533312";
  ul_test[0x26].num = 0xc000000000;
  ul_test[0x26].expected = "824633720832";
  ul_test[0x27].num = 0xc00000000;
  ul_test[0x27].expected = "51539607552";
  ul_test[0x28].num = 0xc0000000;
  ul_test[0x28].expected = "3221225472";
  ul_test[0x29].num = 0xc000000;
  ul_test[0x29].expected = "201326592";
  ul_test[0x2a].num = 0xc00000;
  ul_test[0x2a].expected = "12582912";
  ul_test[0x2b].num = 0xc0000;
  ul_test[0x2b].expected = "786432";
  ul_test[0x2c].num = 0xc000;
  ul_test[0x2c].expected = "49152";
  ul_test[0x2d].num = 0xc00;
  ul_test[0x2d].expected = "3072";
  ul_test[0x2e].num = 0xc0;
  ul_test[0x2e].expected = "192";
  ul_test[0x2f].num = 0xc;
  ul_test[0x2f].expected = "12";
  ul_test[0x30].num = 1;
  ul_test[0x30].expected = "1";
  ul_test[0x31].num = 0;
  ul_test[0x31].expected = "0";
  lVar41 = 0x122ef0;
  local_26c = 0;
  for (uVar44 = 1; uVar44 != 0x32; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = ul_test[uVar44].result;
    ul_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%lu",ul_test[uVar44].num);
    pcVar42 = ul_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("unsigned long test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_26c = local_26c + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() unsigned long tests Failed!\n";
  if (local_26c == 0) {
    pcVar42 = "All curl_mprintf() unsigned long tests OK!\n";
  }
  curl_mprintf(pcVar42);
  sl_test[1].num = 0x7fffffffffffffff;
  sl_test[1].expected = "9223372036854775807";
  sl_test[2].num = 0x7ffffffffffffffe;
  sl_test[2].expected = "9223372036854775806";
  sl_test[3].num = 0x7ffffffffffffffd;
  sl_test[3].expected = "9223372036854775805";
  sl_test[4].num = 0x7fffffff00000000;
  sl_test[4].expected = "9223372032559808512";
  sl_test[5].num = 0x7fffffff;
  sl_test[5].expected = "2147483647";
  sl_test[6].num = 0x7fff000000000000;
  sl_test[6].expected = "9223090561878065152";
  sl_test[7].num = 0x7fff00000000;
  sl_test[7].expected = "140733193388032";
  sl_test[8].num = 0x7fff0000;
  sl_test[8].expected = "2147418112";
  sl_test[9].num = 0x7fff;
  sl_test[9].expected = "32767";
  sl_test[10].num = 0x7f00000000000000;
  sl_test[10].expected = "9151314442816847872";
  sl_test[0xb].num = 0x7f000000000000;
  sl_test[0xb].expected = "35747322042253312";
  sl_test[0xc].num = 0x7f0000000000;
  sl_test[0xc].expected = "139637976727552";
  sl_test[0xd].num = 0x7f00000000;
  sl_test[0xd].expected = "545460846592";
  sl_test[0xe].num = 0x7f000000;
  sl_test[0xe].expected = "2130706432";
  sl_test[0xf].num = 0x7f0000;
  sl_test[0xf].expected = "8323072";
  sl_test[0x10].num = 0x7f00;
  sl_test[0x10].expected = "32512";
  sl_test[0x11].num = 0x7f;
  sl_test[0x11].expected = "127";
  sl_test[0x12].num = 0x7000000000000000;
  sl_test[0x12].expected = "8070450532247928832";
  sl_test[0x13].num = 0x700000000000000;
  sl_test[0x13].expected = "504403158265495552";
  sl_test[0x14].num = 0x70000000000000;
  sl_test[0x14].expected = "31525197391593472";
  sl_test[0x15].num = 0x7000000000000;
  sl_test[0x15].expected = "1970324836974592";
  sl_test[0x16].num = 0x700000000000;
  sl_test[0x16].expected = "123145302310912";
  sl_test[0x17].num = 0x70000000000;
  sl_test[0x17].expected = "7696581394432";
  sl_test[0x18].num = 0x7000000000;
  sl_test[0x18].expected = "481036337152";
  sl_test[0x19].num = 0x700000000;
  sl_test[0x19].expected = "30064771072";
  sl_test[0x1a].num = 0x70000000;
  sl_test[0x1a].expected = "1879048192";
  sl_test[0x1b].num = 0x7000000;
  sl_test[0x1b].expected = "117440512";
  sl_test[0x1c].num = 0x700000;
  sl_test[0x1c].expected = "7340032";
  sl_test[0x1d].num = 0x70000;
  sl_test[0x1d].expected = "458752";
  sl_test[0x1e].num = 0x7000;
  sl_test[0x1e].expected = "28672";
  sl_test[0x1f].num = 0x700;
  sl_test[0x1f].expected = "1792";
  sl_test[0x20].num = 0x70;
  sl_test[0x20].expected = "112";
  sl_test[0x21].num = 7;
  sl_test[0x21].expected = "7";
  sl_test[0x22].num = 1;
  sl_test[0x22].expected = "1";
  sl_test[0x23].num = 0;
  sl_test[0x23].expected = "0";
  sl_test[0x24].num = -0x8000000000000000;
  sl_test[0x24].expected = "-9223372036854775808";
  sl_test[0x25].num = -0x7fffffffffffffff;
  sl_test[0x25].expected = "-9223372036854775807";
  sl_test[0x26].num = -0x7ffffffffffffffe;
  sl_test[0x26].expected = "-9223372036854775806";
  sl_test[0x27].num = -0x7fffffff00000001;
  sl_test[0x27].expected = "-9223372032559808513";
  sl_test[0x28].num = -0x80000000;
  sl_test[0x28].expected = "-2147483648";
  sl_test[0x29].num = -0x7fff000000000001;
  sl_test[0x29].expected = "-9223090561878065153";
  sl_test[0x2a].num = -0x7fff00000001;
  sl_test[0x2a].expected = "-140733193388033";
  sl_test[0x2b].num = -0x7fff0001;
  sl_test[0x2b].expected = "-2147418113";
  sl_test[0x2c].num = -0x8000;
  sl_test[0x2c].expected = "-32768";
  sl_test[0x2d].num = -0x7f00000000000001;
  sl_test[0x2d].expected = "-9151314442816847873";
  sl_test[0x2e].num = -0x7f000000000001;
  sl_test[0x2e].expected = "-35747322042253313";
  sl_test[0x2f].num = -0x7f0000000001;
  sl_test[0x2f].expected = "-139637976727553";
  sl_test[0x30].num = -0x7f00000001;
  sl_test[0x30].expected = "-545460846593";
  sl_test[0x31].num = -0x7f000001;
  sl_test[0x31].expected = "-2130706433";
  sl_test[0x32].num = -0x7f0001;
  sl_test[0x32].expected = "-8323073";
  sl_test[0x33].num = -0x7f01;
  sl_test[0x33].expected = "-32513";
  sl_test[0x34].num = -0x80;
  sl_test[0x34].expected = "-128";
  sl_test[0x35].num = -0x7000000000000001;
  sl_test[0x35].expected = "-8070450532247928833";
  sl_test[0x36].num = -0x700000000000001;
  sl_test[0x36].expected = "-504403158265495553";
  sl_test[0x37].num = -0x70000000000001;
  sl_test[0x37].expected = "-31525197391593473";
  sl_test[0x38].num = -0x7000000000001;
  sl_test[0x38].expected = "-1970324836974593";
  sl_test[0x39].num = -0x700000000001;
  sl_test[0x39].expected = "-123145302310913";
  sl_test[0x3a].num = -0x70000000001;
  sl_test[0x3a].expected = "-7696581394433";
  sl_test[0x3b].num = -0x7000000001;
  sl_test[0x3b].expected = "-481036337153";
  sl_test[0x3c].num = -0x700000001;
  sl_test[0x3c].expected = "-30064771073";
  sl_test[0x3d].num = -0x70000001;
  sl_test[0x3d].expected = "-1879048193";
  sl_test[0x3e].num = -0x7000001;
  sl_test[0x3e].expected = "-117440513";
  sl_test[0x3f].num = -0x700001;
  sl_test[0x3f].expected = "-7340033";
  sl_test[0x40].num = -0x70001;
  sl_test[0x40].expected = "-458753";
  sl_test[0x41].num = -0x7001;
  sl_test[0x41].expected = "-28673";
  sl_test[0x42].num = -0x701;
  sl_test[0x42].expected = "-1793";
  sl_test[0x43].num = -0x71;
  sl_test[0x43].expected = "-113";
  sl_test[0x44].num = -8;
  sl_test[0x44].expected = "-8";
  sl_test[0x45].num = -1;
  sl_test[0x45].expected = "-1";
  lVar41 = 0x129a40;
  local_270 = 0;
  for (uVar44 = 1; uVar44 != 0x46; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = sl_test[uVar44].result;
    sl_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%ld",sl_test[uVar44].num);
    pcVar42 = sl_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar3 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar3 != 0) {
      curl_mprintf("signed long test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      local_270 = local_270 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() signed long tests Failed!\n";
  if (local_270 == 0) {
    pcVar42 = "All curl_mprintf() signed long tests OK!\n";
  }
  curl_mprintf(pcVar42);
  co_test[1].num = 0x7fffffffffffffff;
  co_test[1].expected = "9223372036854775807";
  co_test[2].num = 0x7ffffffffffffffe;
  co_test[2].expected = "9223372036854775806";
  co_test[3].num = 0x7ffffffffffffffd;
  co_test[3].expected = "9223372036854775805";
  co_test[4].num = 0x7fffffff00000000;
  co_test[4].expected = "9223372032559808512";
  co_test[5].num = 0x7fffffff;
  co_test[5].expected = "2147483647";
  co_test[6].num = 0x7fff000000000000;
  co_test[6].expected = "9223090561878065152";
  co_test[7].num = 0x7fff00000000;
  co_test[7].expected = "140733193388032";
  co_test[8].num = 0x7fff0000;
  co_test[8].expected = "2147418112";
  co_test[9].num = 0x7fff;
  co_test[9].expected = "32767";
  co_test[10].num = 0x7f00000000000000;
  co_test[10].expected = "9151314442816847872";
  co_test[0xb].num = 0x7f000000000000;
  co_test[0xb].expected = "35747322042253312";
  co_test[0xc].num = 0x7f0000000000;
  co_test[0xc].expected = "139637976727552";
  co_test[0xd].num = 0x7f00000000;
  co_test[0xd].expected = "545460846592";
  co_test[0xe].num = 0x7f000000;
  co_test[0xe].expected = "2130706432";
  co_test[0xf].num = 0x7f0000;
  co_test[0xf].expected = "8323072";
  co_test[0x10].num = 0x7f00;
  co_test[0x10].expected = "32512";
  co_test[0x11].num = 0x7f;
  co_test[0x11].expected = "127";
  co_test[0x12].num = 0x7000000000000000;
  co_test[0x12].expected = "8070450532247928832";
  co_test[0x13].num = 0x700000000000000;
  co_test[0x13].expected = "504403158265495552";
  co_test[0x14].num = 0x70000000000000;
  co_test[0x14].expected = "31525197391593472";
  co_test[0x15].num = 0x7000000000000;
  co_test[0x15].expected = "1970324836974592";
  co_test[0x16].num = 0x700000000000;
  co_test[0x16].expected = "123145302310912";
  co_test[0x17].num = 0x70000000000;
  co_test[0x17].expected = "7696581394432";
  co_test[0x18].num = 0x7000000000;
  co_test[0x18].expected = "481036337152";
  co_test[0x19].num = 0x700000000;
  co_test[0x19].expected = "30064771072";
  co_test[0x1a].num = 0x70000000;
  co_test[0x1a].expected = "1879048192";
  co_test[0x1b].num = 0x7000000;
  co_test[0x1b].expected = "117440512";
  co_test[0x1c].num = 0x700000;
  co_test[0x1c].expected = "7340032";
  co_test[0x1d].num = 0x70000;
  co_test[0x1d].expected = "458752";
  co_test[0x1e].num = 0x7000;
  co_test[0x1e].expected = "28672";
  co_test[0x1f].num = 0x700;
  co_test[0x1f].expected = "1792";
  co_test[0x20].num = 0x70;
  co_test[0x20].expected = "112";
  co_test[0x21].num = 7;
  co_test[0x21].expected = "7";
  co_test[0x22].num = 1;
  co_test[0x22].expected = "1";
  co_test[0x23].num = 0;
  co_test[0x23].expected = "0";
  co_test[0x24].num = -0x8000000000000000;
  co_test[0x24].expected = "-9223372036854775808";
  co_test[0x25].num = -0x7fffffffffffffff;
  co_test[0x25].expected = "-9223372036854775807";
  co_test[0x26].num = -0x7ffffffffffffffe;
  co_test[0x26].expected = "-9223372036854775806";
  co_test[0x27].num = -0x7fffffff00000001;
  co_test[0x27].expected = "-9223372032559808513";
  co_test[0x28].num = -0x80000000;
  co_test[0x28].expected = "-2147483648";
  co_test[0x29].num = -0x7fff000000000001;
  co_test[0x29].expected = "-9223090561878065153";
  co_test[0x2a].num = -0x7fff00000001;
  co_test[0x2a].expected = "-140733193388033";
  co_test[0x2b].num = -0x7fff0001;
  co_test[0x2b].expected = "-2147418113";
  co_test[0x2c].num = -0x8000;
  co_test[0x2c].expected = "-32768";
  co_test[0x2d].num = -0x7f00000000000001;
  co_test[0x2d].expected = "-9151314442816847873";
  co_test[0x2e].num = -0x7f000000000001;
  co_test[0x2e].expected = "-35747322042253313";
  co_test[0x2f].num = -0x7f0000000001;
  co_test[0x2f].expected = "-139637976727553";
  co_test[0x30].num = -0x7f00000001;
  co_test[0x30].expected = "-545460846593";
  co_test[0x31].num = -0x7f000001;
  co_test[0x31].expected = "-2130706433";
  co_test[0x32].num = -0x7f0001;
  co_test[0x32].expected = "-8323073";
  co_test[0x33].num = -0x7f01;
  co_test[0x33].expected = "-32513";
  co_test[0x34].num = -0x80;
  co_test[0x34].expected = "-128";
  co_test[0x35].num = -0x7000000000000001;
  co_test[0x35].expected = "-8070450532247928833";
  co_test[0x36].num = -0x700000000000001;
  co_test[0x36].expected = "-504403158265495553";
  co_test[0x37].num = -0x70000000000001;
  co_test[0x37].expected = "-31525197391593473";
  co_test[0x38].num = -0x7000000000001;
  co_test[0x38].expected = "-1970324836974593";
  co_test[0x39].num = -0x700000000001;
  co_test[0x39].expected = "-123145302310913";
  co_test[0x3a].num = -0x70000000001;
  co_test[0x3a].expected = "-7696581394433";
  co_test[0x3b].num = -0x7000000001;
  co_test[0x3b].expected = "-481036337153";
  co_test[0x3c].num = -0x700000001;
  co_test[0x3c].expected = "-30064771073";
  co_test[0x3d].num = -0x70000001;
  co_test[0x3d].expected = "-1879048193";
  co_test[0x3e].num = -0x7000001;
  co_test[0x3e].expected = "-117440513";
  co_test[0x3f].num = -0x700001;
  co_test[0x3f].expected = "-7340033";
  co_test[0x40].num = -0x70001;
  co_test[0x40].expected = "-458753";
  co_test[0x41].num = -0x7001;
  co_test[0x41].expected = "-28673";
  co_test[0x42].num = -0x701;
  co_test[0x42].expected = "-1793";
  co_test[0x43].num = -0x71;
  co_test[0x43].expected = "-113";
  co_test[0x44].num = -8;
  co_test[0x44].expected = "-8";
  co_test[0x45].num = -1;
  co_test[0x45].expected = "-1";
  lVar41 = 0x130590;
  iVar3 = 0;
  for (uVar44 = 1; uVar44 != 0x46; uVar44 = uVar44 + 1) {
    for (lVar39 = 0; lVar39 != 0x100; lVar39 = lVar39 + 1) {
      *(undefined1 *)(lVar41 + lVar39) = 0x58;
    }
    pcVar43 = co_test[uVar44].result;
    co_test[uVar44].result[0xff] = '\0';
    curl_msprintf(pcVar43,"%ld",co_test[uVar44].num);
    pcVar42 = co_test[uVar44].expected;
    sVar40 = strlen(pcVar42);
    iVar4 = bcmp(pcVar43,pcVar42,sVar40);
    if (iVar4 != 0) {
      curl_mprintf("curl_off_t test #%.2d: Failed (Expected: %s Got: %s)\n",uVar44 & 0xffffffff,
                   pcVar42,pcVar43);
      iVar3 = iVar3 + 1;
    }
    lVar41 = lVar41 + 0x110;
  }
  pcVar42 = "Some curl_mprintf() curl_off_t tests Failed!\n";
  if (iVar3 == 0) {
    pcVar42 = "All curl_mprintf() curl_off_t tests OK!\n";
  }
  curl_mprintf(pcVar42);
  curl_msnprintf(local_238,0x100,"%0*d%s",2,9,"foo");
  iVar4 = _string_check(0x589,local_238,"09foo");
  curl_msnprintf(local_238,0x100,"%*.*s",5,2,"foo");
  iVar5 = _string_check(0x58c,local_238,"   fo");
  curl_msnprintf(local_238,0x100,"%*.*s",2,5,"foo");
  iVar6 = _string_check(0x58f,local_238,"foo");
  curl_msnprintf(local_238,0x100,"%*.*s",0,10,"foo");
  iVar7 = _string_check(0x592,local_238,"foo");
  curl_msnprintf(local_238,0x100,"%-10s","foo");
  iVar8 = _string_check(0x595,local_238,"foo       ");
  curl_msnprintf(local_238,0x100,"%10s","foo");
  iVar9 = _string_check(0x598,local_238,"       foo");
  curl_msnprintf(local_238,0x100,"%*.*s",0xfffffffffffffff6,0xfffffff6,"foo");
  iVar10 = _string_check(0x59b,local_238,"foo       ");
  iVar4 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4;
  pcVar42 = "Some curl_mprintf() string tests Failed!\n";
  if (iVar4 == 0) {
    pcVar42 = "All curl_mprintf() strings tests OK!\n";
  }
  curl_mprintf(pcVar42);
  curl_msnprintf(0x4022000000000000,local_238,0x200,"%f");
  iVar5 = _string_check(0x613,local_238,"9.000000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%.1f");
  iVar6 = _string_check(0x616,local_238,"9.1");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%.2f");
  iVar7 = _string_check(0x619,local_238,"9.10");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%.0f");
  iVar8 = _string_check(0x61c,local_238,"9");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%0f");
  iVar9 = _string_check(0x61f,local_238,"9.100000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%10f");
  iVar10 = _string_check(0x622,local_238,"  9.100000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%10.3f");
  iVar11 = _string_check(0x625,local_238,"     9.100");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%-10.3f");
  iVar12 = _string_check(0x628,local_238,"9.100     ");
  curl_msnprintf(0x40223f359ff4fd6d,local_238,0x200,"%-10.3f");
  iVar13 = _string_check(0x62b,local_238,"9.123     ");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%.-2f");
  iVar14 = _string_check(0x62e,local_238,"9.100000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%*f",10);
  iVar15 = _string_check(0x631,local_238,"  9.100000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%*f",3);
  iVar16 = _string_check(0x634,local_238,"9.100000");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%*f",6);
  iVar17 = _string_check(0x637,local_238,"9.298765");
  curl_msnprintf(0x402298f7b9e060fe,local_238,0x200,"%*f",6);
  iVar18 = _string_check(0x63a,local_238,"9.298765");
  curl_msnprintf(0x402298f7121ab4b7,local_238,0x200,"%*f",6);
  iVar19 = _string_check(0x63d,local_238,"9.298760");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",6);
  iVar20 = _string_check(0x640,local_238,"9.298765");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",5);
  iVar21 = _string_check(0x642,local_238,"9.29877");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",4);
  iVar22 = _string_check(0x644,local_238,"9.2988");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",3);
  iVar23 = _string_check(0x646,local_238,"9.299");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",2);
  iVar24 = _string_check(0x648,local_238,"9.30");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",1);
  iVar25 = _string_check(0x64a,local_238,"9.3");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",0);
  iVar26 = _string_check(0x64c,local_238,"9");
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%.*f",0x40000000);
  iVar27 = _strlen_check(0x652,local_238,0x145);
  curl_msnprintf(0x402298f7c74c5a4c,local_238,0x200,"%10000.10000f");
  iVar28 = _strlen_check(0x655,local_238,0x145);
  curl_msnprintf(0x455987bf7cb8ec68,local_238,0x200,"%240.10000f");
  iVar29 = _strlen_check(0x659,local_238,0x145);
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%*f",0x80000000);
  iVar30 = _string_check(0x65d,local_238,"9.100000");
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%*f",0x40000000);
  iVar31 = _string_check(0x662,local_238,
                         "                                                                                                                                                                                                                                                                                                                             9.100000"
                        );
  curl_msnprintf(0x4022333333333333,local_238,0x200,"%100000f");
  iVar32 = _string_check(0x664,local_238,
                         "                                                                                                                                                                                                                                                                                                                             9.100000"
                        );
  curl_msnprintf(0xffefffffffffffff,local_238,0x200,"%f");
  iVar33 = _strlen_check(0x667,local_238,0x13d);
  curl_msnprintf(0xffefffffffffffff,local_238,2,"%f");
  iVar34 = _strlen_check(0x66a,local_238,1);
  curl_msnprintf(0xffefffffffffffff,local_238,3,"%f");
  iVar35 = _strlen_check(0x66c,local_238,2);
  curl_msnprintf(0xffefffffffffffff,local_238,4,"%f");
  iVar36 = _strlen_check(0x66e,local_238,3);
  curl_msnprintf(0xffefffffffffffff,local_238,5,"%f");
  iVar37 = _strlen_check(0x670,local_238,4);
  curl_msnprintf(0xffefffffffffffff,local_238,6,"%f");
  iVar38 = _strlen_check(0x672,local_238,5);
  iVar5 = iVar38 + iVar37 + iVar36 + iVar35 + iVar34 +
          iVar33 + iVar32 + iVar31 + iVar30 + iVar29 + iVar28 + iVar27 +
          iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 +
          iVar20 + iVar19 + iVar18 + iVar17 + iVar16 +
          iVar15 + iVar14 + iVar13 + iVar12 +
          iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5;
  pcVar42 = "test_float_formatting Failed!\n";
  if (iVar5 == 0) {
    pcVar42 = "All float strings tests OK!\n";
  }
  curl_mprintf(pcVar42);
  iVar6 = 0x7e;
  if (iVar5 + iVar4 + local_268 + local_26c + local_270 +
                      local_260 + local_264 + local_274 + iVar1 + iVar2 + iVar3 == 0) {
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int test(char *URL)
{
  int errors = 0;
  (void)URL; /* not used */

#ifdef HAVE_SETLOCALE
  /*
   * The test makes assumptions about the numeric locale (specifically,
   * RADIXCHAR) so set it to a known working (and portable) one.
   */
  setlocale(LC_NUMERIC, "C");
#endif

  errors += test_weird_arguments();

  errors += test_unsigned_short_formatting();

  errors += test_signed_short_formatting();

  errors += test_unsigned_int_formatting();

  errors += test_signed_int_formatting();

  errors += test_unsigned_long_formatting();

  errors += test_signed_long_formatting();

  errors += test_curl_off_t_formatting();

  errors += test_string_formatting();

  errors += test_float_formatting();

  if(errors)
    return TEST_ERR_MAJOR_BAD;
  else
    return 0;
}